

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  seqStore_t *psVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  seqDef *psVar9;
  uint uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *mEnd;
  int iVar13;
  int *piVar14;
  int *piVar15;
  BYTE *litEnd_1;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  BYTE *litEnd;
  U32 UVar19;
  long lVar20;
  ZSTD_matchState_t *pZVar21;
  ulong uVar22;
  int *ip;
  size_t ofbCandidate;
  BYTE *litLimit_w;
  U32 local_f0;
  U32 local_ec;
  size_t local_e8;
  ZSTD_matchState_t *local_e0;
  BYTE *local_d8;
  ulong local_d0;
  int *local_c8;
  uint local_bc;
  BYTE *local_b8;
  BYTE *local_b0;
  int *local_a8;
  BYTE *local_a0;
  uint local_94;
  BYTE *local_90;
  BYTE *local_88;
  U32 *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  BYTE *local_60;
  seqStore_t *local_58;
  int *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pBVar11 = (BYTE *)((long)src + srcSize);
  local_c8 = (int *)((long)src + (srcSize - 8));
  local_b0 = (ms->window).base;
  uVar5 = (ms->window).dictLimit;
  local_d0 = (ulong)uVar5;
  local_b8 = local_b0 + local_d0;
  uVar18 = (ms->cParams).minMatch;
  uVar10 = 6;
  if (uVar18 < 6) {
    uVar10 = uVar18;
  }
  local_bc = 4;
  if (4 < uVar10) {
    local_bc = uVar10;
  }
  pZVar21 = ms->dictMatchState;
  local_a0 = (pZVar21->window).nextSrc;
  local_88 = (pZVar21->window).base;
  local_60 = local_88 + (pZVar21->window).dictLimit;
  iVar13 = (int)local_a0;
  local_f0 = *rep;
  piVar14 = (int *)((ulong)(((int)src - ((int)local_60 + (int)local_b8)) + iVar13 == 0) + (long)src)
  ;
  local_ec = rep[1];
  ms->lazySkipping = 0;
  if (piVar14 < local_c8) {
    local_94 = ((int)local_88 - iVar13) + uVar5;
    local_90 = local_88 + -(ulong)local_94;
    local_a8 = (int *)(pBVar11 + -0x20);
    iVar17 = (int)local_b0;
    local_68 = (ulong)((1 - uVar5) - iVar17);
    local_78 = (ulong)(uint)-iVar17;
    local_70 = (ulong)((((iVar13 - uVar5) - (int)local_88) - iVar17) + 1);
    local_e0 = ms;
    local_d8 = pBVar11;
    local_80 = rep;
    local_58 = seqStore;
    do {
      iVar13 = (int)piVar14;
      uVar5 = ((iVar13 - (int)local_b0) - local_f0) + 1;
      uVar18 = (uint)local_d0;
      piVar15 = (int *)(local_b0 + uVar5);
      if (uVar5 < uVar18) {
        piVar15 = (int *)(local_88 + (uVar5 - local_94));
      }
      if ((uVar5 - uVar18 < 0xfffffffd) && (*piVar15 == *(int *)((long)piVar14 + 1))) {
        pBVar12 = pBVar11;
        if (uVar5 < uVar18) {
          pBVar12 = local_a0;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar14 + 5),(BYTE *)(piVar15 + 1),pBVar11,pBVar12,
                           local_b8);
        uVar22 = sVar6 + 4;
      }
      else {
        uVar22 = 0;
      }
      pZVar21 = local_e0;
      local_e8 = 999999999;
      if (local_bc == 6) {
        uVar7 = ZSTD_HcFindBestMatch_dictMatchState_6(local_e0,(BYTE *)piVar14,pBVar11,&local_e8);
      }
      else if (local_bc == 5) {
        uVar7 = ZSTD_HcFindBestMatch_dictMatchState_5(local_e0,(BYTE *)piVar14,pBVar11,&local_e8);
      }
      else {
        uVar7 = ZSTD_HcFindBestMatch_dictMatchState_4(local_e0,(BYTE *)piVar14,pBVar11,&local_e8);
      }
      uVar8 = uVar22;
      if (uVar22 < uVar7) {
        uVar8 = uVar7;
      }
      if (uVar8 < 4) {
        pZVar21->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar14 - (long)src));
        pBVar11 = local_d8;
        piVar14 = (int *)((long)piVar14 + ((ulong)((long)piVar14 - (long)src) >> 8) + 1);
      }
      else {
        piVar15 = piVar14;
        uVar16 = local_e8;
        if (uVar7 <= uVar22) {
          piVar15 = (int *)((long)piVar14 + 1);
          uVar16 = 1;
        }
        uVar22 = uVar8;
        if (piVar14 < local_c8) {
          local_38 = (ulong)(((int)local_68 + iVar13) - local_f0);
          local_40 = (ulong)(((int)local_78 + iVar13) - local_f0);
          local_48 = (ulong)(((int)local_70 + iVar13) - local_f0);
          lVar20 = 0;
          local_50 = piVar14;
          do {
            ip = (int *)((long)local_50 + lVar20 + 1);
            iVar13 = (int)lVar20;
            uVar5 = (int)local_40 + iVar13 + 1;
            piVar14 = (int *)(local_b0 + uVar5);
            if (uVar5 < (uint)local_d0) {
              piVar14 = (int *)(local_88 + (uint)((int)local_48 + iVar13));
            }
            uVar22 = uVar8;
            if (((uint)((int)local_38 + iVar13) < 0xfffffffd) && (*piVar14 == *ip)) {
              pBVar11 = local_d8;
              if (uVar5 < (uint)local_d0) {
                pBVar11 = local_a0;
              }
              sVar6 = ZSTD_count_2segments
                                ((BYTE *)((long)local_50 + lVar20 + 5),(BYTE *)(piVar14 + 1),
                                 local_d8,pBVar11,local_b8);
              if (sVar6 < 0xfffffffffffffffc) {
                uVar5 = 0x1f;
                if ((uint)uVar16 != 0) {
                  for (; (uint)uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                  }
                }
                if ((int)((uVar5 ^ 0x1f) + (int)uVar8 * 3 + -0x1e) < (int)(sVar6 + 4) * 3) {
                  uVar16 = 1;
                  uVar22 = sVar6 + 4;
                  piVar15 = ip;
                }
              }
            }
            local_e8 = 999999999;
            if (local_bc == 6) {
              uVar8 = ZSTD_HcFindBestMatch_dictMatchState_6(local_e0,(BYTE *)ip,local_d8,&local_e8);
            }
            else if (local_bc == 5) {
              uVar8 = ZSTD_HcFindBestMatch_dictMatchState_5(local_e0,(BYTE *)ip,local_d8,&local_e8);
            }
            else {
              uVar8 = ZSTD_HcFindBestMatch_dictMatchState_4(local_e0,(BYTE *)ip,local_d8,&local_e8);
            }
            pZVar21 = local_e0;
            if (uVar8 < 4) goto LAB_018c0fd8;
            uVar5 = 0x1f;
            if ((uint)uVar16 != 0) {
              for (; (uint)uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            iVar13 = 0x1f;
            if ((uint)local_e8 != 0) {
              for (; (uint)local_e8 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            if ((int)uVar8 * 4 - iVar13 <= (int)((uVar5 ^ 0x1f) + (int)uVar22 * 4 + -0x1b))
            goto LAB_018c0fd8;
            lVar3 = lVar20 + 1;
            lVar20 = lVar20 + 1;
            uVar16 = local_e8;
            piVar15 = ip;
          } while ((int *)((long)local_50 + lVar3) < local_c8);
          piVar15 = (int *)((long)local_50 + lVar20);
          uVar22 = uVar8;
        }
LAB_018c0fd8:
        psVar4 = local_58;
        if (3 < uVar16) {
          uVar7 = (long)piVar15 + (-(long)local_b0 - uVar16) + -0xfffffffd;
          pBVar12 = local_b0;
          pBVar11 = local_b8;
          if ((uint)uVar7 < (uint)local_d0) {
            pBVar12 = local_90;
            pBVar11 = local_60;
          }
          if ((src < piVar15) && (uVar7 = uVar7 & 0xffffffff, pBVar11 < pBVar12 + uVar7)) {
            pBVar12 = pBVar12 + uVar7;
            do {
              piVar14 = (int *)((long)piVar15 + -1);
              pBVar12 = pBVar12 + -1;
              if ((*(BYTE *)piVar14 != *pBVar12) ||
                 (uVar22 = uVar22 + 1, piVar15 = piVar14, piVar14 <= src)) break;
            } while (pBVar11 < pBVar12);
          }
          local_ec = local_f0;
          local_f0 = (U32)uVar16 - 3;
        }
        uVar7 = (long)piVar15 - (long)src;
        pBVar11 = local_58->lit;
        if (local_a8 < piVar15) {
          ZSTD_safecopyLiterals(pBVar11,(BYTE *)src,(BYTE *)piVar15,(BYTE *)local_a8);
LAB_018c109b:
          psVar4->lit = psVar4->lit + uVar7;
          psVar9 = psVar4->sequences;
          if (0xffff < uVar7) {
            psVar4->longLengthType = ZSTD_llt_literalLength;
            psVar4->longLengthPos = (U32)((ulong)((long)psVar9 - (long)psVar4->sequencesStart) >> 3)
            ;
          }
        }
        else {
          uVar2 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar11 = *src;
          *(undefined8 *)(pBVar11 + 8) = uVar2;
          pBVar11 = local_58->lit;
          if (0x10 < uVar7) {
            uVar2 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar11 + 0x18) = uVar2;
            if (0x20 < (long)uVar7) {
              lVar20 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar20 + 0x20);
                uVar2 = puVar1[1];
                pBVar12 = pBVar11 + lVar20 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar2;
                puVar1 = (undefined8 *)((long)src + lVar20 + 0x30);
                uVar2 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar2;
                lVar20 = lVar20 + 0x20;
              } while (pBVar12 + 0x20 < pBVar11 + uVar7);
            }
            goto LAB_018c109b;
          }
          local_58->lit = pBVar11 + uVar7;
          psVar9 = local_58->sequences;
        }
        pBVar11 = local_d8;
        psVar9->litLength = (U16)uVar7;
        psVar9->offBase = (U32)uVar16;
        if (0xffff < uVar22 - 3) {
          psVar4->longLengthType = ZSTD_llt_matchLength;
          psVar4->longLengthPos = (U32)((ulong)((long)psVar9 - (long)psVar4->sequencesStart) >> 3);
        }
        psVar9->mlBase = (U16)(uVar22 - 3);
        psVar4->sequences = psVar9 + 1;
        if (pZVar21->lazySkipping != 0) {
          pZVar21->lazySkipping = 0;
        }
        src = (void *)((long)piVar15 + uVar22);
        piVar14 = (int *)src;
        if (src <= local_c8) {
          do {
            UVar19 = local_ec;
            uVar5 = ((int)src - (int)local_b0) - UVar19;
            uVar18 = (uint)local_d0;
            pBVar12 = local_b0;
            if (uVar5 < uVar18) {
              pBVar12 = local_90;
            }
            piVar14 = (int *)src;
            local_ec = UVar19;
            if ((0xfffffffc < uVar5 - uVar18) || (*(int *)(pBVar12 + uVar5) != *src)) break;
            mEnd = pBVar11;
            if (uVar5 < uVar18) {
              mEnd = local_a0;
            }
            sVar6 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar12 + uVar5) + 4),pBVar11
                               ,mEnd,local_b8);
            pBVar12 = psVar4->lit;
            if (local_a8 < src) {
              ZSTD_safecopyLiterals(pBVar12,(BYTE *)src,(BYTE *)src,(BYTE *)local_a8);
            }
            else {
              uVar2 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar12 = *src;
              *(undefined8 *)(pBVar12 + 8) = uVar2;
            }
            psVar9 = psVar4->sequences;
            psVar9->litLength = 0;
            psVar9->offBase = 1;
            if (0xffff < sVar6 + 1) {
              psVar4->longLengthType = ZSTD_llt_matchLength;
              psVar4->longLengthPos =
                   (U32)((ulong)((long)psVar9 - (long)psVar4->sequencesStart) >> 3);
            }
            psVar9->mlBase = (U16)(sVar6 + 1);
            psVar4->sequences = psVar9 + 1;
            src = (void *)((long)src + sVar6 + 4);
            piVar14 = (int *)src;
            local_ec = local_f0;
            local_f0 = UVar19;
          } while (src <= local_c8);
        }
      }
      rep = local_80;
    } while (piVar14 < local_c8);
  }
  *rep = local_f0;
  rep[1] = local_ec;
  return (long)pBVar11 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}